

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_ldm_fillFastTables(ZSTD_matchState_t *ms,void *end)

{
  ZSTD_strategy ZVar1;
  size_t extraout_RAX;
  size_t extraout_RAX_00;
  
  ZVar1 = (ms->cParams).strategy;
  if (ZVar1 == ZSTD_dfast) {
    ZSTD_fillDoubleHashTable(ms,end,ZSTD_dtlm_fast,ZSTD_tfp_forCCtx);
    return extraout_RAX_00;
  }
  if (ZVar1 == ZSTD_fast) {
    ZSTD_fillHashTable(ms,end,ZSTD_dtlm_fast,ZSTD_tfp_forCCtx);
    return extraout_RAX;
  }
  return (ulong)ZVar1;
}

Assistant:

static size_t ZSTD_ldm_fillFastTables(ZSTD_matchState_t* ms,
                                      void const* end)
{
    const BYTE* const iend = (const BYTE*)end;

    switch(ms->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, iend, ZSTD_dtlm_fast, ZSTD_tfp_forCCtx);
        break;

    case ZSTD_dfast:
#ifndef ZSTD_EXCLUDE_DFAST_BLOCK_COMPRESSOR
        ZSTD_fillDoubleHashTable(ms, iend, ZSTD_dtlm_fast, ZSTD_tfp_forCCtx);
#else
        assert(0); /* shouldn't be called: cparams should've been adjusted. */
#endif
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
    case ZSTD_btlazy2:
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
        break;
    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    return 0;
}